

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O2

void print_http_headers(http_message_t *hmsg)

{
  http_method_t hVar1;
  uint uVar2;
  undefined8 *puVar3;
  ListNode *node;
  int DbgLineNo;
  char *FmtStr;
  char *pcVar4;
  
  if (hmsg->is_request == 0) {
    hVar1 = hmsg->status_code;
    uVar2 = (uint)(hmsg->status_msg).length;
    FmtStr = "resp status = %d, version = %d.%d, status msg = %.*s\n";
    DbgLineNo = 0x8c5;
    pcVar4 = (hmsg->status_msg).buf;
  }
  else {
    hVar1 = hmsg->method;
    uVar2 = (uint)(hmsg->uri).pathquery.size;
    FmtStr = "method = %d, version = %d.%d, url = %.*s\n";
    DbgLineNo = 0x8ba;
    pcVar4 = (hmsg->uri).pathquery.buff;
  }
  UpnpPrintf(UPNP_ALL,HTTP,".upnp/src/genlib/net/http/httpparser.c",DbgLineNo,FmtStr,(ulong)hVar1,
             (ulong)(uint)hmsg->major_version,(ulong)(uint)hmsg->minor_version,(ulong)uVar2,pcVar4);
  for (node = ListHead(&hmsg->headers); node != (ListNode *)0x0;
      node = ListNext(&hmsg->headers,node)) {
    puVar3 = (undefined8 *)node->item;
    UpnpPrintf(UPNP_ALL,HTTP,".upnp/src/genlib/net/http/httpparser.c",0x8d8,
               "hdr name: %.*s, value: %.*s\n",(ulong)*(uint *)(puVar3 + 1),*puVar3,
               (ulong)*(uint *)(puVar3 + 4),puVar3[3]);
  }
  return;
}

Assistant:

void print_http_headers(http_message_t *hmsg)
{
	ListNode *node;
	/* NNS:	 dlist_node *node; */
	http_header_t *header;

	/* print start line */
	if (hmsg->is_request) {
		UpnpPrintf(UPNP_ALL,
			HTTP,
			__FILE__,
			__LINE__,
			"method = %d, version = %d.%d, url = %.*s\n",
			hmsg->method,
			hmsg->major_version,
			hmsg->minor_version,
			(int)hmsg->uri.pathquery.size,
			hmsg->uri.pathquery.buff);
	} else {
		UpnpPrintf(UPNP_ALL,
			HTTP,
			__FILE__,
			__LINE__,
			"resp status = %d, version = %d.%d, status msg = "
			"%.*s\n",
			hmsg->status_code,
			hmsg->major_version,
			hmsg->minor_version,
			(int)hmsg->status_msg.length,
			hmsg->status_msg.buf);
	}

	/* print headers */
	node = ListHead(&hmsg->headers);
	/* NNS: node = dlist_first_node( &hmsg->headers ); */
	while (node != NULL) {
		header = (http_header_t *)node->item;
		/* NNS: header = (http_header_t *)node->data; */
		UpnpPrintf(UPNP_ALL,
			HTTP,
			__FILE__,
			__LINE__,
			"hdr name: %.*s, value: %.*s\n",
			(int)header->name.length,
			header->name.buf,
			(int)header->value.length,
			header->value.buf);

		node = ListNext(&hmsg->headers, node);
		/* NNS: node = dlist_next( &hmsg->headers, node ); */
	}
}